

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_8ae11::ir_constant_propagation_visitor::handle_rvalue
          (ir_constant_propagation_visitor *this,ir_rvalue **rvalue)

{
  byte bVar1;
  byte bVar2;
  ir_node_type iVar3;
  glsl_type *this_00;
  exec_list *peVar4;
  ir_rvalue *piVar5;
  byte bVar6;
  bool bVar7;
  ir_rvalue *piVar8;
  void *mem_ctx;
  ir_constant *this_01;
  uint uVar9;
  ir_rvalue *ptr;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  exec_node *peVar14;
  ir_constant_data data;
  
  if (((this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
       in_assignee == false) && (ptr = *rvalue, ptr != (ir_rvalue *)0x0)) {
    this_00 = ptr->type;
    if ((this_00->vector_elements != '\x01') || (0xd < (*(uint *)&this_00->field_0x4 & 0xfe))) {
      bVar7 = glsl_type::is_vector(this_00);
      if (!bVar7) goto LAB_0017dc64;
      ptr = *rvalue;
    }
    iVar3 = (ptr->super_ir_instruction).ir_type;
    if (ptr == (ir_rvalue *)0x0 || iVar3 != ir_type_dereference_variable) {
      if (((iVar3 != ir_type_swizzle || ptr == (ir_rvalue *)0x0) ||
          (piVar5 = (ir_rvalue *)ptr[1].super_ir_instruction._vptr_ir_instruction,
          piVar5 == (ir_rvalue *)0x0)) ||
         (piVar8 = ptr, ptr = piVar5,
         (piVar5->super_ir_instruction).ir_type != ir_type_dereference_variable)) goto LAB_0017dc64;
    }
    else {
      piVar8 = (ir_rvalue *)0x0;
    }
    data.d[0xe] = 0.0;
    data.d[0xf] = 0.0;
    data.d[0xc] = 0.0;
    data.d[0xd] = 0.0;
    data.d[10] = 0.0;
    data.d[0xb] = 0.0;
    data.d[8] = 0.0;
    data.d[9] = 0.0;
    data.d[6] = 0.0;
    data.d[7] = 0.0;
    data.d[4] = 0.0;
    data.d[5] = 0.0;
    data.d[2] = 0.0;
    data.d[3] = 0.0;
    data.d[0] = 0.0;
    data.d[1] = 0.0;
    peVar4 = this->acp;
    bVar1 = this_00->vector_elements;
    bVar2 = this_00->matrix_columns;
    for (uVar12 = 0; uVar12 != (ulong)bVar2 * (ulong)bVar1; uVar12 = uVar12 + 1) {
      uVar9 = (uint)uVar12;
      if (piVar8 != (ir_rvalue *)0x0) {
        switch(uVar12 & 0xffffffff) {
        case 0:
          uVar9 = (uint)*(ushort *)&piVar8[1].super_ir_instruction.super_exec_node.next;
          break;
        case 1:
          uVar9 = *(uint *)&piVar8[1].super_ir_instruction.super_exec_node.next >> 2;
          break;
        case 2:
          uVar9 = *(uint *)&piVar8[1].super_ir_instruction.super_exec_node.next >> 4;
          break;
        case 3:
          uVar9 = *(uint *)&piVar8[1].super_ir_instruction.super_exec_node.next >> 6;
          break;
        default:
          __assert_fail("!\"shouldn\'t be reached\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_propagation.cpp"
                        ,0xb7,
                        "void (anonymous namespace)::ir_constant_propagation_visitor::constant_propagation(ir_rvalue **)"
                       );
        }
        uVar9 = uVar9 & 3;
      }
      peVar14 = (peVar4->head_sentinel).next;
      bVar6 = (byte)uVar9 & 0x1f;
      while( true ) {
        if (peVar14->next == (exec_node *)0x0) {
          peVar14 = (exec_node *)0x0;
        }
        if (peVar14 == (exec_node *)0x0) goto LAB_0017dc64;
        if ((peVar14[1].next == (exec_node *)ptr[1].super_ir_instruction._vptr_ir_instruction) &&
           ((*(uint *)&peVar14[2].next & 1 << bVar6) != 0)) break;
        peVar14 = peVar14->next;
      }
      if (3 < uVar9) {
        uVar9 = 4;
      }
      uVar11 = 0 << bVar6;
      for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
        uVar11 = uVar11 + ((*(uint *)((long)&peVar14[2].next + 4) >> (uVar13 & 0x1f) & 1) != 0);
      }
      if (0xb < (byte)this_00->field_0x4) {
switchD_0017dd8e_caseD_5:
        __assert_fail("!\"not reached\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_propagation.cpp"
                      ,0xe9,
                      "void (anonymous namespace)::ir_constant_propagation_visitor::constant_propagation(ir_rvalue **)"
                     );
      }
      uVar10 = (ulong)uVar11;
      switch(this_00->field_0x4) {
      case 0:
      case 1:
        *(undefined4 *)((long)&data + uVar12 * 4) =
             *(undefined4 *)((long)&peVar14[1].prev[2].prev + uVar10 * 4);
        break;
      case 2:
        *(undefined4 *)((long)&data + uVar12 * 4) =
             *(undefined4 *)((long)&peVar14[1].prev[2].prev + uVar10 * 4);
        break;
      case 3:
        *(undefined2 *)((long)&data + uVar12 * 2) =
             *(undefined2 *)((long)&peVar14[1].prev[2].prev + uVar10 * 2);
        break;
      case 4:
        *(exec_node **)((long)&data + uVar12 * 8) = (&peVar14[1].prev[2].prev)[uVar10];
        break;
      default:
        goto switchD_0017dd8e_caseD_5;
      case 9:
      case 10:
        *(exec_node **)((long)&data + uVar12 * 8) = (&peVar14[1].prev[2].prev)[uVar10];
        break;
      case 0xb:
        data.b[uVar12] = *(bool *)((long)&peVar14[1].prev[2].prev + uVar10);
      }
    }
    mem_ctx = ralloc_parent(ptr);
    this_01 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    ir_constant::ir_constant(this_01,this_00,&data);
    *rvalue = (ir_rvalue *)this_01;
    this->progress = true;
  }
LAB_0017dc64:
  constant_folding(this,rvalue);
  return;
}

Assistant:

void
ir_constant_propagation_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   constant_propagation(rvalue);
   constant_folding(rvalue);
}